

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

bool testing::Test::HasSameFixtureClass(void)

{
  TestInfo *pTVar1;
  TestInfo *pTVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  ostream *poVar8;
  char *__s;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  
  UnitTest::GetInstance();
  pTVar1 = (UnitTest::GetInstance::instance.impl_)->current_test_info_;
  pTVar2 = *((UnitTest::GetInstance::instance.impl_)->current_test_case_->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar3 = (undefined1 *)pTVar2->fixture_class_id_;
  puVar4 = (undefined1 *)pTVar1->fixture_class_id_;
  if (puVar4 != puVar3) {
    pcVar6 = (pTVar2->name_)._M_dataplus._M_p;
    __s = (pTVar1->name_)._M_dataplus._M_p;
    if ((puVar3 == &internal::TypeIdHelper<testing::Test>::dummy_) ||
       (puVar4 == &internal::TypeIdHelper<testing::Test>::dummy_)) {
      pcVar7 = pcVar6;
      if (puVar3 == &internal::TypeIdHelper<testing::Test>::dummy_) {
        pcVar7 = __s;
        __s = pcVar6;
      }
      Message::Message((Message *)&local_40);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40.ptr_ + 0x10),
                 "All tests in the same test case must use the same test fixture\n",0x3f);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40.ptr_ + 0x10),
                 "class, so mixing TEST_F and TEST in the same test case is\n",0x3a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40.ptr_ + 0x10),"illegal.  In test case ",0x17);
      pcVar6 = (pTVar1->test_case_name_)._M_dataplus._M_p;
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (pcVar6 == (char *)0x0) {
        sVar5 = 6;
        pcVar6 = "(null)";
      }
      else {
        sVar5 = strlen(pcVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar6,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_40.ptr_ + 0x10),",\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40.ptr_ + 0x10),"test ",5);
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (pcVar7 == (char *)0x0) {
        sVar5 = 6;
        pcVar7 = "(null)";
      }
      else {
        sVar5 = strlen(pcVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40.ptr_ + 0x10)," is defined using TEST_F but\n",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40.ptr_ + 0x10),"test ",5);
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (__s == (char *)0x0) {
        sVar5 = 6;
        __s = "(null)";
      }
      else {
        sVar5 = strlen(__s);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,__s,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40.ptr_ + 0x10)," is defined using TEST.  You probably\n",0x26);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40.ptr_ + 0x10),
                 "want to change the TEST to TEST_F or move it to another test\n",0x3d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40.ptr_ + 0x10),"case.",5);
      internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/thirdparty/gmock/gmock-gtest-all.cc"
                 ,0xd86,"Failed");
      internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    }
    else {
      Message::Message((Message *)&local_40);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40.ptr_ + 0x10),
                 "All tests in the same test case must use the same test fixture\n",0x3f);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40.ptr_ + 0x10),"class.  However, in test case ",0x1e);
      pcVar7 = (pTVar1->test_case_name_)._M_dataplus._M_p;
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (pcVar7 == (char *)0x0) {
        sVar5 = 6;
        pcVar7 = "(null)";
      }
      else {
        sVar5 = strlen(pcVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_40.ptr_ + 0x10),",\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40.ptr_ + 0x10),"you defined test ",0x11);
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (pcVar6 == (char *)0x0) {
        sVar5 = 6;
        pcVar6 = "(null)";
      }
      else {
        sVar5 = strlen(pcVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar6,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40.ptr_ + 0x10)," and test ",10);
      poVar8 = (ostream *)(local_40.ptr_ + 0x10);
      if (__s == (char *)0x0) {
        sVar5 = 6;
        __s = "(null)";
      }
      else {
        sVar5 = strlen(__s);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,__s,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_40.ptr_ + 0x10),"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40.ptr_ + 0x10),
                 "using two different test fixture classes.  This can happen if\n",0x3e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40.ptr_ + 0x10),
                 "the two classes are from different namespaces or translation\n",0x3d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40.ptr_ + 0x10),
                 "units and have the same name.  You should probably rename one\n",0x3e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_40.ptr_ + 0x10),
                 "of the classes to put the tests into different test cases.",0x3a);
      internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/thirdparty/gmock/gmock-gtest-all.cc"
                 ,0xd92,"Failed");
      internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    }
    internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40.ptr_ + 8))();
    }
  }
  return puVar4 == puVar3;
}

Assistant:

inline UnitTestImpl* GetUnitTestImpl() {
  return UnitTest::GetInstance()->impl();
}